

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-apply.cc
# Opt level: O1

bool tinyusdz::tydra::ApplyToCollection
               (Prim *prim,function<bool_(const_tinyusdz::Collection_*)> *fn)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  Scope *in_RAX;
  Scope *pSVar3;
  GPrim *pGVar4;
  Xform *pXVar5;
  GeomMesh *pGVar6;
  GeomSphere *pGVar7;
  GeomCapsule *pGVar8;
  GeomCube *pGVar9;
  GeomPoints *pGVar10;
  GeomCylinder *pGVar11;
  GeomBasisCurves *pGVar12;
  GeomSubset *pGVar13;
  SphereLight *pSVar14;
  byte unaff_BPL;
  Value *this;
  Scope *local_28;
  
  pvVar1 = (prim->_data).v_.vtable;
  local_28 = in_RAX;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar2 = (*pvVar1->type_id)();
    if (uVar2 < 0x403) goto LAB_005f2f26;
    pvVar1 = (prim->_data).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar2 = (*pvVar1->type_id)();
      if (0x410 < uVar2) goto LAB_005f2f26;
    }
    goto LAB_005f2f50;
  }
LAB_005f2f26:
  pvVar1 = (prim->_data).v_.vtable;
  if (pvVar1 != (vtable_type *)0x0) {
    uVar2 = (*pvVar1->type_id)();
    if (0x5ff < uVar2) {
      pvVar1 = (prim->_data).v_.vtable;
      if (pvVar1 != (vtable_type *)0x0) {
        uVar2 = (*pvVar1->type_id)();
        if (0x609 < uVar2) goto LAB_005f2f85;
      }
LAB_005f2f50:
      this = &prim->_data;
      pSVar3 = (Scope *)tinyusdz::value::Value::as<tinyusdz::Model>(this,false);
      if (pSVar3 != (Scope *)0x0) {
        local_28 = pSVar3;
        if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
        unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
      }
      if (pSVar3 == (Scope *)0x0) {
        pSVar3 = tinyusdz::value::Value::as<tinyusdz::Scope>(this,false);
        if (pSVar3 != (Scope *)0x0) {
          local_28 = pSVar3;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pSVar3 != (Scope *)0x0) goto LAB_005f3243;
        pGVar4 = tinyusdz::value::Value::as<tinyusdz::GPrim>(this,false);
        if (pGVar4 != (GPrim *)0x0) {
          local_28 = (Scope *)&pGVar4->super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar4 != (GPrim *)0x0) goto LAB_005f3243;
        pXVar5 = tinyusdz::value::Value::as<tinyusdz::Xform>(this,false);
        if (pXVar5 != (Xform *)0x0) {
          local_28 = (Scope *)&(pXVar5->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pXVar5 != (Xform *)0x0) goto LAB_005f3243;
        pGVar6 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>(this,false);
        if (pGVar6 != (GeomMesh *)0x0) {
          local_28 = (Scope *)&(pGVar6->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar6 != (GeomMesh *)0x0) goto LAB_005f3243;
        pGVar7 = tinyusdz::value::Value::as<tinyusdz::GeomSphere>(this,false);
        if (pGVar7 != (GeomSphere *)0x0) {
          local_28 = (Scope *)&(pGVar7->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar7 != (GeomSphere *)0x0) goto LAB_005f3243;
        pGVar8 = tinyusdz::value::Value::as<tinyusdz::GeomCapsule>(this,false);
        if (pGVar8 != (GeomCapsule *)0x0) {
          local_28 = (Scope *)&(pGVar8->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar8 != (GeomCapsule *)0x0) goto LAB_005f3243;
        pGVar9 = tinyusdz::value::Value::as<tinyusdz::GeomCube>(this,false);
        if (pGVar9 != (GeomCube *)0x0) {
          local_28 = (Scope *)&(pGVar9->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar9 != (GeomCube *)0x0) goto LAB_005f3243;
        pGVar10 = tinyusdz::value::Value::as<tinyusdz::GeomPoints>(this,false);
        if (pGVar10 != (GeomPoints *)0x0) {
          local_28 = (Scope *)&(pGVar10->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar10 != (GeomPoints *)0x0) goto LAB_005f3243;
        pGVar11 = tinyusdz::value::Value::as<tinyusdz::GeomCylinder>(this,false);
        if (pGVar11 != (GeomCylinder *)0x0) {
          local_28 = (Scope *)&(pGVar11->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar11 != (GeomCylinder *)0x0) goto LAB_005f3243;
        pGVar12 = tinyusdz::value::Value::as<tinyusdz::GeomBasisCurves>(this,false);
        if (pGVar12 != (GeomBasisCurves *)0x0) {
          local_28 = (Scope *)&(pGVar12->super_GPrim).super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar12 != (GeomBasisCurves *)0x0) goto LAB_005f3243;
        pGVar13 = tinyusdz::value::Value::as<tinyusdz::GeomSubset>(this,false);
        if (pGVar13 != (GeomSubset *)0x0) {
          local_28 = (Scope *)&pGVar13->super_Collection;
          if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_005f3254;
          unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
        }
        if (pGVar13 == (GeomSubset *)0x0) {
          unaff_BPL = 0;
          pSVar14 = tinyusdz::value::Value::as<tinyusdz::SphereLight>(this,false);
          if (pSVar14 != (SphereLight *)0x0) {
            local_28 = (Scope *)&(pSVar14->super_BoundableLight).super_Collection;
            if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_005f3254:
              ::std::__throw_bad_function_call();
            }
            unaff_BPL = (*fn->_M_invoker)((_Any_data *)fn,(Collection **)&local_28);
          }
        }
      }
      goto LAB_005f3243;
    }
  }
LAB_005f2f85:
  unaff_BPL = 0;
LAB_005f3243:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ApplyToCollection(
  const Prim &prim,
  std::function<bool(const Collection *col)> fn) {

  if ((value::TypeId::TYPE_ID_GPRIM <= prim.type_id() &&
      (value::TypeId::TYPE_ID_GEOM_END > prim.type_id()))) {
    // gprim or geomsubset
  } else if ((value::TypeId::TYPE_ID_LUX_BEGIN <= prim.type_id() &&
      (value::TypeId::TYPE_ID_LUX_END > prim.type_id()))) {
    // usdLux
  } else {
    return false;
  }

#define APPLY_FUN(__ty) { \
  const auto *v = prim.as<__ty>(); \
  if (v) { \
    return fn(v); \
  } \
  }

  APPLY_FUN(Model)
  APPLY_FUN(Scope)
  APPLY_FUN(GPrim)
  APPLY_FUN(Xform)
  APPLY_FUN(GeomMesh)
  APPLY_FUN(GeomSphere)
  APPLY_FUN(GeomCapsule)
  APPLY_FUN(GeomCube)
  APPLY_FUN(GeomPoints)
  APPLY_FUN(GeomCylinder)
  APPLY_FUN(GeomBasisCurves)
  APPLY_FUN(GeomSubset)
  APPLY_FUN(SphereLight)

#undef APPLY_FUN

  return false;

}